

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRailing::~IfcRailing(IfcRailing *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x91a678;
  *(undefined8 *)&this->field_0x180 = 0x91a790;
  *(undefined8 *)&this->field_0x88 = 0x91a6a0;
  *(undefined8 *)&this->field_0x98 = 0x91a6c8;
  *(undefined8 *)&this->field_0xd0 = 0x91a6f0;
  *(undefined8 *)&this->field_0x100 = 0x91a718;
  *(undefined8 *)&this->field_0x138 = 0x91a740;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x91a768;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__0091a7b0);
  operator_delete(this,0x198);
  return;
}

Assistant:

IfcRailing() : Object("IfcRailing") {}